

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O1

void __thiscall
icu_63::DateTimeMatcher::set
          (DateTimeMatcher *this,UnicodeString *pattern,FormatParser *fp,PtnSkeleton *skeletonResult
          )

{
  char cVar1;
  ushort uVar2;
  short sVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  uint uVar12;
  char16_t *pcVar13;
  int8_t iVar14;
  short sVar15;
  char16_t cVar16;
  long lVar17;
  UnicodeString *s;
  int iVar18;
  UnicodeString quoteLiteral;
  int32_t local_84;
  DateTimeMatcher *local_80;
  UObject local_78;
  UnicodeString local_70;
  
  skeletonResult->type[0xc] = 0;
  skeletonResult->type[0xd] = 0;
  skeletonResult->type[0xe] = 0;
  skeletonResult->type[0xf] = 0;
  skeletonResult->type[8] = 0;
  skeletonResult->type[9] = 0;
  skeletonResult->type[10] = 0;
  skeletonResult->type[0xb] = 0;
  skeletonResult->type[4] = 0;
  skeletonResult->type[5] = 0;
  skeletonResult->type[6] = 0;
  skeletonResult->type[7] = 0;
  skeletonResult->type[0] = 0;
  skeletonResult->type[1] = 0;
  skeletonResult->type[2] = 0;
  skeletonResult->type[3] = 0;
  local_84 = 0x10;
  (skeletonResult->baseOriginal).lengths[0] = '\0';
  (skeletonResult->baseOriginal).lengths[1] = '\0';
  (skeletonResult->baseOriginal).lengths[2] = '\0';
  (skeletonResult->baseOriginal).lengths[3] = '\0';
  (skeletonResult->baseOriginal).lengths[4] = '\0';
  (skeletonResult->baseOriginal).lengths[5] = '\0';
  (skeletonResult->baseOriginal).lengths[6] = '\0';
  (skeletonResult->baseOriginal).lengths[7] = '\0';
  (skeletonResult->baseOriginal).lengths[8] = '\0';
  (skeletonResult->baseOriginal).lengths[9] = '\0';
  (skeletonResult->baseOriginal).lengths[10] = '\0';
  (skeletonResult->baseOriginal).lengths[0xb] = '\0';
  (skeletonResult->baseOriginal).lengths[0xc] = '\0';
  (skeletonResult->baseOriginal).lengths[0xd] = '\0';
  (skeletonResult->baseOriginal).lengths[0xe] = '\0';
  (skeletonResult->baseOriginal).lengths[0xf] = '\0';
  (skeletonResult->baseOriginal).chars[0] = '\0';
  (skeletonResult->baseOriginal).chars[1] = '\0';
  (skeletonResult->baseOriginal).chars[2] = '\0';
  (skeletonResult->baseOriginal).chars[3] = '\0';
  (skeletonResult->baseOriginal).chars[4] = '\0';
  (skeletonResult->baseOriginal).chars[5] = '\0';
  (skeletonResult->baseOriginal).chars[6] = '\0';
  (skeletonResult->baseOriginal).chars[7] = '\0';
  (skeletonResult->baseOriginal).chars[8] = '\0';
  (skeletonResult->baseOriginal).chars[9] = '\0';
  (skeletonResult->baseOriginal).chars[10] = '\0';
  (skeletonResult->baseOriginal).chars[0xb] = '\0';
  (skeletonResult->baseOriginal).chars[0xc] = '\0';
  (skeletonResult->baseOriginal).chars[0xd] = '\0';
  (skeletonResult->baseOriginal).chars[0xe] = '\0';
  (skeletonResult->baseOriginal).chars[0xf] = '\0';
  (skeletonResult->original).lengths[0] = '\0';
  (skeletonResult->original).lengths[1] = '\0';
  (skeletonResult->original).lengths[2] = '\0';
  (skeletonResult->original).lengths[3] = '\0';
  (skeletonResult->original).lengths[4] = '\0';
  (skeletonResult->original).lengths[5] = '\0';
  (skeletonResult->original).lengths[6] = '\0';
  (skeletonResult->original).lengths[7] = '\0';
  (skeletonResult->original).lengths[8] = '\0';
  (skeletonResult->original).lengths[9] = '\0';
  (skeletonResult->original).lengths[10] = '\0';
  (skeletonResult->original).lengths[0xb] = '\0';
  (skeletonResult->original).lengths[0xc] = '\0';
  (skeletonResult->original).lengths[0xd] = '\0';
  (skeletonResult->original).lengths[0xe] = '\0';
  (skeletonResult->original).lengths[0xf] = '\0';
  (skeletonResult->original).chars[0] = '\0';
  (skeletonResult->original).chars[1] = '\0';
  (skeletonResult->original).chars[2] = '\0';
  (skeletonResult->original).chars[3] = '\0';
  (skeletonResult->original).chars[4] = '\0';
  (skeletonResult->original).chars[5] = '\0';
  (skeletonResult->original).chars[6] = '\0';
  (skeletonResult->original).chars[7] = '\0';
  (skeletonResult->original).chars[8] = '\0';
  (skeletonResult->original).chars[9] = '\0';
  (skeletonResult->original).chars[10] = '\0';
  (skeletonResult->original).chars[0xb] = '\0';
  (skeletonResult->original).chars[0xc] = '\0';
  (skeletonResult->original).chars[0xd] = '\0';
  (skeletonResult->original).chars[0xe] = '\0';
  (skeletonResult->original).chars[0xf] = '\0';
  skeletonResult->addedDefaultDayPeriod = '\0';
  local_80 = this;
  FormatParser::set(fp,pattern);
  local_84 = 0;
  if (0 < fp->itemNumber) {
    local_78._vptr_UObject = (_func_int **)&PTR__UnicodeString_0048be70;
    do {
      lVar17 = (long)local_84 * 0x40;
      uVar2 = *(ushort *)(&fp->field_0x10 + lVar17);
      if ((short)uVar2 < 0) {
        iVar18 = *(int *)(&fp->field_0x14 + lVar17);
      }
      else {
        iVar18 = (int)(short)uVar2 >> 5;
      }
      s = (UnicodeString *)(&fp->field_0x8 + lVar17);
      if (iVar18 == 0) {
LAB_002ea008:
        uVar12 = FormatParser::getCanonicalIndex(s,'\x01');
        if (-1 < (int)uVar12) {
          if (iVar18 == 0) {
            iVar14 = -1;
          }
          else {
            if ((uVar2 & 2) == 0) {
              pcVar13 = (s->fUnion).fFields.fArray;
            }
            else {
              pcVar13 = (char16_t *)((long)&s->fUnion + 2);
            }
            iVar14 = (int8_t)*pcVar13;
          }
          lVar17 = (ulong)uVar12 * 0x10;
          iVar4 = *(int *)(&DAT_003aa084 + lVar17);
          (skeletonResult->original).chars[iVar4] = iVar14;
          (skeletonResult->original).lengths[iVar4] = (int8_t)iVar18;
          iVar14 = (&DAT_003aa08a)[lVar17];
          (skeletonResult->baseOriginal).chars[iVar4] = *(int8_t *)(&dtTypes + (ulong)uVar12 * 8);
          (skeletonResult->baseOriginal).lengths[iVar4] = iVar14;
          sVar15 = *(short *)(&DAT_003aa088 + lVar17);
          if (0 < sVar15) {
            sVar3 = (s->fUnion).fStackFields.fLengthAndFlags;
            if (sVar3 < 0) {
              cVar16 = (s->fUnion).fStackFields.fBuffer[1];
            }
            else {
              cVar16 = (char16_t)((uint)(int)sVar3 >> 5);
            }
            sVar15 = sVar15 + cVar16;
          }
          skeletonResult->type[iVar4] = (int)sVar15;
        }
      }
      else {
        if ((uVar2 & 2) == 0) {
          pcVar13 = (s->fUnion).fFields.fArray;
        }
        else {
          pcVar13 = (s->fUnion).fStackFields.fBuffer;
        }
        if (*pcVar13 != L'\'') goto LAB_002ea008;
        local_70.super_Replaceable.super_UObject._vptr_UObject =
             (UObject)(UObject)local_78._vptr_UObject;
        local_70.fUnion.fStackFields.fLengthAndFlags = 2;
        FormatParser::getQuoteLiteral(fp,&local_70,&local_84);
        icu_63::UnicodeString::~UnicodeString(&local_70);
      }
      local_84 = local_84 + 1;
    } while (local_84 < fp->itemNumber);
  }
  if ((skeletonResult->original).lengths[0xb] != '\0') {
    cVar1 = (skeletonResult->original).chars[0xb];
    if ((cVar1 == 'h') || (cVar1 == 'K')) {
      if ((skeletonResult->original).lengths[10] == '\0') {
        (skeletonResult->original).chars[10] = 'a';
        (skeletonResult->original).lengths[10] = '\x01';
        (skeletonResult->baseOriginal).chars[10] = 'a';
        (skeletonResult->baseOriginal).lengths[10] = '\x01';
        skeletonResult->type[10] = -0x103;
        skeletonResult->addedDefaultDayPeriod = '\x01';
      }
    }
    else {
      (skeletonResult->original).chars[10] = '\0';
      (skeletonResult->original).lengths[10] = '\0';
      (skeletonResult->baseOriginal).chars[10] = '\0';
      (skeletonResult->baseOriginal).lengths[10] = '\0';
      skeletonResult->type[10] = 0;
    }
  }
  uVar5 = *(undefined8 *)skeletonResult->type;
  uVar6 = *(undefined8 *)(skeletonResult->type + 2);
  uVar7 = *(undefined8 *)(skeletonResult->type + 4);
  uVar8 = *(undefined8 *)(skeletonResult->type + 6);
  uVar9 = *(undefined8 *)(skeletonResult->type + 8);
  uVar10 = *(undefined8 *)(skeletonResult->type + 10);
  uVar11 = *(undefined8 *)(skeletonResult->type + 0xe);
  *(undefined8 *)((local_80->skeleton).type + 0xc) = *(undefined8 *)(skeletonResult->type + 0xc);
  *(undefined8 *)((local_80->skeleton).type + 0xe) = uVar11;
  *(undefined8 *)((local_80->skeleton).type + 8) = uVar9;
  *(undefined8 *)((local_80->skeleton).type + 10) = uVar10;
  *(undefined8 *)((local_80->skeleton).type + 4) = uVar7;
  *(undefined8 *)((local_80->skeleton).type + 6) = uVar8;
  *(undefined8 *)(local_80->skeleton).type = uVar5;
  *(undefined8 *)((local_80->skeleton).type + 2) = uVar6;
  uVar5 = *(undefined8 *)((skeletonResult->original).chars + 8);
  *(undefined8 *)(local_80->skeleton).original.chars =
       *(undefined8 *)(skeletonResult->original).chars;
  *(undefined8 *)((local_80->skeleton).original.chars + 8) = uVar5;
  uVar5 = *(undefined8 *)((skeletonResult->original).lengths + 8);
  *(undefined8 *)(local_80->skeleton).original.lengths =
       *(undefined8 *)(skeletonResult->original).lengths;
  *(undefined8 *)((local_80->skeleton).original.lengths + 8) = uVar5;
  uVar5 = *(undefined8 *)((skeletonResult->baseOriginal).chars + 8);
  *(undefined8 *)(local_80->skeleton).baseOriginal.chars =
       *(undefined8 *)(skeletonResult->baseOriginal).chars;
  *(undefined8 *)((local_80->skeleton).baseOriginal.chars + 8) = uVar5;
  uVar5 = *(undefined8 *)((skeletonResult->baseOriginal).lengths + 8);
  *(undefined8 *)(local_80->skeleton).baseOriginal.lengths =
       *(undefined8 *)(skeletonResult->baseOriginal).lengths;
  *(undefined8 *)((local_80->skeleton).baseOriginal.lengths + 8) = uVar5;
  return;
}

Assistant:

void
DateTimeMatcher::set(const UnicodeString& pattern, FormatParser* fp, PtnSkeleton& skeletonResult) {
    int32_t i;
    for (i=0; i<UDATPG_FIELD_COUNT; ++i) {
        skeletonResult.type[i] = NONE;
    }
    skeletonResult.original.clear();
    skeletonResult.baseOriginal.clear();
    skeletonResult.addedDefaultDayPeriod = FALSE;

    fp->set(pattern);
    for (i=0; i < fp->itemNumber; i++) {
        const UnicodeString& value = fp->items[i];
        // don't skip 'a' anymore, dayPeriod handled specially below

        if ( fp->isQuoteLiteral(value) ) {
            UnicodeString quoteLiteral;
            fp->getQuoteLiteral(quoteLiteral, &i);
            continue;
        }
        int32_t canonicalIndex = fp->getCanonicalIndex(value);
        if (canonicalIndex < 0) {
            continue;
        }
        const dtTypeElem *row = &dtTypes[canonicalIndex];
        int32_t field = row->field;
        skeletonResult.original.populate(field, value);
        UChar repeatChar = row->patternChar;
        int32_t repeatCount = row->minLen;
        skeletonResult.baseOriginal.populate(field, repeatChar, repeatCount);
        int16_t subField = row->type;
        if (row->type > 0) {
            U_ASSERT(value.length() < INT16_MAX);
            subField += static_cast<int16_t>(value.length());
        }
        skeletonResult.type[field] = subField;
    }
    // #13183, handle special behavior for day period characters (a, b, B)
    if (!skeletonResult.original.isFieldEmpty(UDATPG_HOUR_FIELD)) {
        if (skeletonResult.original.getFieldChar(UDATPG_HOUR_FIELD)==LOW_H || skeletonResult.original.getFieldChar(UDATPG_HOUR_FIELD)==CAP_K) {
            // We have a skeleton with 12-hour-cycle format
            if (skeletonResult.original.isFieldEmpty(UDATPG_DAYPERIOD_FIELD)) {
                // But we do not have a day period in the skeleton; add the default DAYPERIOD (currently "a")
                for (i = 0; dtTypes[i].patternChar != 0; i++) {
                    if ( dtTypes[i].field == UDATPG_DAYPERIOD_FIELD ) {
                        // first entry for UDATPG_DAYPERIOD_FIELD
                        skeletonResult.original.populate(UDATPG_DAYPERIOD_FIELD, dtTypes[i].patternChar, dtTypes[i].minLen);
                        skeletonResult.baseOriginal.populate(UDATPG_DAYPERIOD_FIELD, dtTypes[i].patternChar, dtTypes[i].minLen);
                        skeletonResult.type[UDATPG_DAYPERIOD_FIELD] = dtTypes[i].type;
                        skeletonResult.addedDefaultDayPeriod = TRUE;
                        break;
                    }
                }
            }
        } else {
            // Skeleton has 24-hour-cycle hour format and has dayPeriod, delete dayPeriod (i.e. ignore it)
            skeletonResult.original.clearField(UDATPG_DAYPERIOD_FIELD);
            skeletonResult.baseOriginal.clearField(UDATPG_DAYPERIOD_FIELD);
            skeletonResult.type[UDATPG_DAYPERIOD_FIELD] = NONE;
        }
    }
    copyFrom(skeletonResult);
}